

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-unwrap.cpp
# Opt level: O0

CommandOptions * read_JP2K_S_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  _func_int **__s;
  int iVar1;
  AESDecContext *this;
  HMACContext *this_00;
  uint *puVar2;
  IFileReaderFactory *in_RDX;
  uint local_d00;
  Result_t local_cb0 [111];
  allocator<char> local_c41;
  string local_c40 [32];
  string local_c20 [112];
  FileWriter local_bb0 [4];
  ui32_t write_count_1;
  FileWriter OutFile_1;
  Result_t local_b78 [104];
  Result_t local_b10 [111];
  allocator<char> local_aa1;
  string local_aa0 [32];
  string local_a80 [112];
  FileWriter local_a10 [4];
  ui32_t write_count;
  FileWriter OutFile;
  Result_t local_9d8 [108];
  uint local_96c;
  char local_968 [4];
  ui32_t i;
  char right_format [64];
  char left_format [64];
  uint local_8dc;
  char local_8d8 [4];
  ui32_t last_frame;
  char filename [1024];
  Result_t local_4d0 [4];
  int filename_max;
  undefined1 local_468 [112];
  WriterInfo Info;
  undefined1 local_2e8 [116];
  PictureDescriptor PDesc;
  uint local_78;
  ui32_t frame_count;
  undefined1 local_68 [8];
  FrameBuffer FrameBuffer;
  MXFSReader Reader;
  HMACContext *HMAC;
  AESDecContext *Context;
  IFileReaderFactory *fileReaderFactory_local;
  CommandOptions *Options_local;
  Result_t *result;
  
  ASDCP::JP2K::MXFSReader::MXFSReader((MXFSReader *)&FrameBuffer.field_0x20,in_RDX);
  ASDCP::JP2K::FrameBuffer::FrameBuffer
            ((FrameBuffer *)local_68,*(ui32_t *)&fileReaderFactory[5]._vptr_IFileReaderFactory);
  local_78 = 0;
  __s = fileReaderFactory[0xc]._vptr_IFileReaderFactory;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(PDesc.CorrespondingProfile.Pcpf + 2),(char *)__s,
             (allocator<char> *)((long)PDesc.CorrespondingProfile.Pcpf + 3));
  ASDCP::JP2K::MXFSReader::OpenRead((string *)Options);
  std::__cxx11::string::~string((string *)(PDesc.CorrespondingProfile.Pcpf + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)PDesc.CorrespondingProfile.Pcpf + 3));
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if (-1 < iVar1) {
    ASDCP::JP2K::PictureDescriptor::PictureDescriptor((PictureDescriptor *)(local_2e8 + 0x6c));
    ASDCP::JP2K::MXFSReader::FillPictureDescriptor((PictureDescriptor *)local_2e8);
    Kumu::Result_t::~Result_t((Result_t *)local_2e8);
    local_78 = PDesc.EditRate.Numerator;
    if (((ulong)fileReaderFactory[1]._vptr_IFileReaderFactory & 0x100) != 0) {
      fprintf(_stderr,"Frame Buffer size: %u\n",
              (ulong)*(uint *)&fileReaderFactory[5]._vptr_IFileReaderFactory);
      ASDCP::JP2K::PictureDescriptorDump((PictureDescriptor *)(local_2e8 + 0x6c),(_IO_FILE *)0x0);
    }
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if ((-1 < iVar1) && (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0)) {
    this = (AESDecContext *)operator_new(8);
    ASDCP::AESDecContext::AESDecContext(this);
    ASDCP::AESDecContext::InitKey((uchar *)&Info.LabelSetType);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info.LabelSetType);
    Kumu::Result_t::~Result_t((Result_t *)&Info.LabelSetType);
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if ((-1 < iVar1) &&
       (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x1000000000000) != 0)) {
      ASDCP::WriterInfo::WriterInfo((WriterInfo *)(local_468 + 0x68));
      ASDCP::JP2K::MXFSReader::FillWriterInfo((WriterInfo *)local_468);
      Kumu::Result_t::~Result_t((Result_t *)local_468);
      if ((Info.CryptographicKeyID[9] & 1) == 0) {
        fputs("File does not contain HMAC values, ignoring -m option.\n",_stderr);
      }
      else {
        this_00 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_00);
        ASDCP::HMACContext::InitKey((uchar *)local_4d0,(LabelSet_t)this_00);
        Kumu::Result_t::operator=((Result_t *)Options,local_4d0);
        Kumu::Result_t::~Result_t(local_4d0);
      }
      ASDCP::WriterInfo::~WriterInfo((WriterInfo *)(local_468 + 0x68));
    }
  }
  filename[0x3fc] = '\0';
  filename[0x3fd] = '\x04';
  filename[0x3fe] = '\0';
  filename[0x3ff] = '\0';
  if (*(int *)((long)&fileReaderFactory[3]._vptr_IFileReaderFactory + 4) == 0) {
    local_d00 = local_78;
  }
  else {
    local_d00 = *(uint *)((long)&fileReaderFactory[3]._vptr_IFileReaderFactory + 4);
  }
  local_8dc = *(int *)&fileReaderFactory[3]._vptr_IFileReaderFactory + local_d00;
  if (local_78 < local_8dc) {
    local_8dc = local_78;
  }
  snprintf(right_format + 0x38,0x40,"%%s%%0%duL.j2c",
           (ulong)*(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4));
  snprintf(local_968,0x40,"%%s%%0%duR.j2c",
           (ulong)*(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4));
  local_96c = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
  while (iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options),
        -1 < iVar1 && local_96c < local_8dc) {
    ASDCP::JP2K::MXFSReader::ReadFrame
              ((uint)local_9d8,(int)&FrameBuffer + 0x20,(FrameBuffer *)(ulong)local_96c,
               (AESDecContext *)0x0,(HMACContext *)local_68);
    Kumu::Result_t::operator=((Result_t *)Options,local_9d8);
    Kumu::Result_t::~Result_t(local_9d8);
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar1) {
      if (((ulong)fileReaderFactory[2]._vptr_IFileReaderFactory & 1) == 0) {
        Kumu::FileWriter::FileWriter(local_a10);
        snprintf(local_8d8,0x400,right_format + 0x38,fileReaderFactory[6]._vptr_IFileReaderFactory,
                 (ulong)local_96c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_aa0,local_8d8,&local_aa1);
        Kumu::FileWriter::OpenWrite(local_a80);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_a80);
        Kumu::Result_t::~Result_t((Result_t *)local_a80);
        std::__cxx11::string::~string(local_aa0);
        std::allocator<char>::~allocator(&local_aa1);
        iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        if (-1 < iVar1) {
          puVar2 = (uint *)ASDCP::FrameBuffer::Data((FrameBuffer *)local_68);
          ASDCP::FrameBuffer::Size((FrameBuffer *)local_68);
          Kumu::FileWriter::Write((uchar *)local_b10,(uint)local_a10,puVar2);
          Kumu::Result_t::operator=((Result_t *)Options,local_b10);
          Kumu::Result_t::~Result_t(local_b10);
        }
        Kumu::FileWriter::~FileWriter(local_a10);
      }
      if (((ulong)fileReaderFactory[1]._vptr_IFileReaderFactory & 0x100) != 0) {
        ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)local_68,(uint)_stderr);
      }
    }
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar1) {
      ASDCP::JP2K::MXFSReader::ReadFrame
                ((uint)local_b78,(int)&FrameBuffer + 0x20,(FrameBuffer *)(ulong)local_96c,
                 (AESDecContext *)0x1,(HMACContext *)local_68);
      Kumu::Result_t::operator=((Result_t *)Options,local_b78);
      Kumu::Result_t::~Result_t(local_b78);
    }
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar1) {
      if (((ulong)fileReaderFactory[2]._vptr_IFileReaderFactory & 1) == 0) {
        Kumu::FileWriter::FileWriter(local_bb0);
        snprintf(local_8d8,0x400,local_968,fileReaderFactory[6]._vptr_IFileReaderFactory,
                 (ulong)local_96c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_c40,local_8d8,&local_c41);
        Kumu::FileWriter::OpenWrite(local_c20);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_c20);
        Kumu::Result_t::~Result_t((Result_t *)local_c20);
        std::__cxx11::string::~string(local_c40);
        std::allocator<char>::~allocator(&local_c41);
        iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        if (-1 < iVar1) {
          puVar2 = (uint *)ASDCP::FrameBuffer::Data((FrameBuffer *)local_68);
          ASDCP::FrameBuffer::Size((FrameBuffer *)local_68);
          Kumu::FileWriter::Write((uchar *)local_cb0,(uint)local_bb0,puVar2);
          Kumu::Result_t::operator=((Result_t *)Options,local_cb0);
          Kumu::Result_t::~Result_t(local_cb0);
        }
        Kumu::FileWriter::~FileWriter(local_bb0);
      }
      if (((ulong)fileReaderFactory[1]._vptr_IFileReaderFactory & 0x100) != 0) {
        ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)local_68,(uint)_stderr);
      }
    }
    local_96c = local_96c + 1;
  }
  ASDCP::JP2K::FrameBuffer::~FrameBuffer((FrameBuffer *)local_68);
  ASDCP::JP2K::MXFSReader::~MXFSReader((MXFSReader *)&FrameBuffer.field_0x20);
  return Options;
}

Assistant:

Result_t
read_JP2K_S_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  JP2K::MXFSReader    Reader(fileReaderFactory);
  JP2K::FrameBuffer  FrameBuffer(Options.fb_size);
  ui32_t             frame_count = 0;

  Result_t result = Reader.OpenRead(Options.input_filename);

  if ( ASDCP_SUCCESS(result) )
    {
      JP2K::PictureDescriptor PDesc;
      Reader.FillPictureDescriptor(PDesc);

      frame_count = PDesc.ContainerDuration;

      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	  JP2K::PictureDescriptorDump(PDesc);
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  const int filename_max = 1024;
  char filename[filename_max];
  ui32_t last_frame = Options.start_frame + ( Options.duration ? Options.duration : frame_count);
  if ( last_frame > frame_count )
    last_frame = frame_count;

  char left_format[64];  char right_format[64];
  snprintf(left_format,  64, "%%s%%0%duL.j2c", Options.number_width);
  snprintf(right_format, 64, "%%s%%0%duR.j2c", Options.number_width);

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, JP2K::SP_LEFT, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( ! Options.no_write_flag )
	    {
	  Kumu::FileWriter OutFile;
	  ui32_t write_count;
	  snprintf(filename, filename_max, left_format, Options.file_prefix, i);
	  result = OutFile.OpenWrite(filename);

	  if ( ASDCP_SUCCESS(result) )
	    result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);
	    }

	  if ( Options.verbose_flag )
	    FrameBuffer.Dump(stderr, Options.fb_dump_size);
	}

      if ( ASDCP_SUCCESS(result) )
	result = Reader.ReadFrame(i, JP2K::SP_RIGHT, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( ! Options.no_write_flag )
	    {
	  Kumu::FileWriter OutFile;
	  ui32_t write_count;
	  snprintf(filename, filename_max, right_format, Options.file_prefix, i);
	  result = OutFile.OpenWrite(filename);

	  if ( ASDCP_SUCCESS(result) )
	    result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);
	}

	  if ( Options.verbose_flag )
	    FrameBuffer.Dump(stderr, Options.fb_dump_size);
    }
    }

  return result;
}